

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O3

void __thiscall QPDF::removeObject(QPDF *this,QPDFObjGen og)

{
  _Base_ptr p_Var1;
  iterator __position;
  map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
  *this_00;
  pair<std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>,_std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
  pVar2;
  QPDFObjGen local_20;
  
  this_00 = &((this->m)._M_t.
              super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
              super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
              super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->xref_table;
  local_20 = og;
  pVar2 = std::
          _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFXRefEntry>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
          ::equal_range(&this_00->_M_t,&local_20);
  std::
  _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFXRefEntry>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
  ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar2.first._M_node,(_Base_ptr)pVar2.second._M_node);
  __position = std::
               _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDF::ObjCache>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
               ::find(&(((this->m)._M_t.
                         super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                         .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->obj_cache).
                       _M_t,&local_20);
  if (__position._M_node !=
      (_Base_ptr)
      ((long)&((this->m)._M_t.
               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
               super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->obj_cache + 8U)) {
    QPDFObject::assign_null((QPDFObject *)__position._M_node[1]._M_parent);
    p_Var1 = __position._M_node[1]._M_parent;
    p_Var1[2]._M_parent = (_Base_ptr)0x0;
    p_Var1[2]._M_left = (_Base_ptr)0x0;
    std::
    _Rb_tree<QPDFObjGen,std::pair<QPDFObjGen_const,QPDF::ObjCache>,std::_Select1st<std::pair<QPDFObjGen_const,QPDF::ObjCache>>,std::less<QPDFObjGen>,std::allocator<std::pair<QPDFObjGen_const,QPDF::ObjCache>>>
    ::erase_abi_cxx11_((_Rb_tree<QPDFObjGen,std::pair<QPDFObjGen_const,QPDF::ObjCache>,std::_Select1st<std::pair<QPDFObjGen_const,QPDF::ObjCache>>,std::less<QPDFObjGen>,std::allocator<std::pair<QPDFObjGen_const,QPDF::ObjCache>>>
                        *)&((this->m)._M_t.
                            super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                            .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->obj_cache,
                       __position);
  }
  return;
}

Assistant:

void
QPDF::removeObject(QPDFObjGen og)
{
    m->xref_table.erase(og);
    if (auto cached = m->obj_cache.find(og); cached != m->obj_cache.end()) {
        // Take care of any object handles that may be floating around.
        cached->second.object->assign_null();
        cached->second.object->setObjGen(nullptr, QPDFObjGen());
        m->obj_cache.erase(cached);
    }
}